

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void chatra::parseInnerNode
               (ParserWorkingSet *ws,IErrorReceiver *errorReceiver,
               shared_ptr<chatra::StringTable> *sTable,Node *node,bool recursive)

{
  pointer pbVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __node_base_ptr *pp_Var3;
  Token **__args_1;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var4;
  NodeType NVar5;
  StringId SVar6;
  Token *pTVar7;
  pointer ppTVar8;
  element_type *peVar9;
  size_type sVar10;
  Token *pTVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  element_type *peVar13;
  StatementPatternElement *pSVar14;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last;
  size_t sVar15;
  pointer psVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  Node *node_00;
  element_type *peVar17;
  _func_int **pp_Var18;
  StatementPatternElement *e;
  __buckets_ptr pp_Var19;
  undefined1 auVar20 [8];
  bool bVar21;
  Node *__tmp;
  pointer ppTVar22;
  long lVar23;
  long *plVar24;
  iterator __position;
  long *plVar25;
  mapped_type *pmVar26;
  undefined8 *puVar27;
  _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var28;
  ulong uVar29;
  ulong *puVar30;
  size_t sVar31;
  ulong uVar32;
  shared_ptr<chatra::Node> *n_1;
  Token **__dest;
  StatementPatternElement *pSVar33;
  pointer psVar34;
  char *pcVar35;
  uint uVar36;
  long *plVar37;
  int iVar38;
  size_type sVar39;
  Token **token;
  Token **ppTVar40;
  element_type *peVar41;
  undefined1 auVar42 [8];
  long lVar43;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var44;
  undefined1 auVar45 [8];
  size_type *psVar46;
  undefined1 local_240 [8];
  AnnotationMap aMap;
  __node_base local_1f8 [2];
  shared_ptr<chatra::StringTable> *local_1e8;
  IErrorReceiver *local_1e0;
  ParserWorkingSet *local_1d8;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *local_1d0;
  undefined1 auStack_1c8 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  undefined1 local_1a8 [23];
  undefined4 uStack_191;
  undefined1 uStack_18d;
  undefined4 uStack_18c;
  undefined1 auStack_188 [8];
  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
  stack;
  undefined1 local_160 [32];
  Node *local_140;
  undefined1 auStack_138 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> pending;
  undefined1 auStack_118 [8];
  AnnotationMap a;
  undefined1 local_c8 [8];
  ParserContext ct;
  undefined1 auStack_a8 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> pending_1;
  undefined1 auStack_88 [8];
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  it;
  Token *local_78;
  _Map_pointer ppsStack_70;
  undefined1 auStack_68 [8];
  shared_ptr<chatra::Node> n;
  __node_base_ptr p_Stack_38;
  
  local_240 = (undefined1  [8])&aMap._M_h._M_rehash_policy._M_next_resize;
  aMap._M_h._M_buckets = (__buckets_ptr)0x1;
  aMap._M_h._M_bucket_count = 0;
  aMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aMap._M_h._M_element_count._0_4_ = 0x3f800000;
  aMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  aMap._M_h._M_rehash_policy._4_4_ = 0;
  aMap._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_138 = (undefined1  [8])0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = &node->blockNodes;
  __position._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = sTable;
  local_1e0 = errorReceiver;
  local_1d8 = ws;
  local_140 = node;
  local_c8 = (undefined1  [8])ws;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  if (__position._M_current !=
      (node->blockNodes).
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      auStack_118 = (undefined1  [8])&a._M_h._M_rehash_policy._M_next_resize;
      a._M_h._M_buckets = (__buckets_ptr)0x1;
      a._M_h._M_bucket_count = 0;
      a._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      a._M_h._M_element_count = CONCAT44(a._M_h._M_element_count._4_4_,0x3f800000);
      a._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      a._M_h._M_rehash_policy._4_4_ = 0;
      a._M_h._M_rehash_policy._M_next_resize = 0;
      auStack_a8 = (undefined1  [8])0x0;
      pending_1.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pending_1.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      peVar41 = ((__position._M_current)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __dest = (peVar41->tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ppTVar40 = (peVar41->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      ct.sTable = (shared_ptr<chatra::StringTable> *)__position._M_current;
      if (__dest != ppTVar40) {
        do {
          if (((long)ppTVar40 - (long)__dest < 9) || (pTVar7 = *__dest, pTVar7->sid != Annotation))
          {
            if ((auStack_a8 !=
                 (undefined1  [8])
                 pending_1.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
               (std::
                _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_emplace<chatra::Token_const*&,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                          ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)auStack_118,__dest,auStack_a8),
               psVar34 = pending_1.
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, auVar20 = auStack_a8,
               auVar42 = auStack_a8,
               (undefined1  [8])
               pending_1.
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start != auStack_a8)) {
              do {
                p_Var12 = (((pointer)auVar42)->
                          super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                          _M_pi;
                if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
                }
                auVar42 = (undefined1  [8])((long)auVar42 + 0x10);
              } while (auVar42 != (undefined1  [8])psVar34);
              pending_1.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar20;
              __position._M_current = (shared_ptr<chatra::Node> *)ct.sTable;
            }
            __dest = __dest + 1;
          }
          else {
            if (__dest[1]->type != Name) {
              if (__dest[1]->sid == OpenBrace) {
                _Var4._M_current = __dest + 2;
                if (_Var4._M_current == ppTVar40) {
                  lVar43 = 0x10;
                }
                else {
                  auStack_188 = (undefined1  [8])0x0;
                  stack.
                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  stack.
                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  lVar43 = 0x10;
                  do {
                    __args_1 = (Token **)((long)__dest + lVar43);
                    if ((auStack_188 ==
                         (undefined1  [8])
                         stack.
                         super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) &&
                       ((*__args_1)->sid == CloseBrace)) break;
                    pTVar7 = *__args_1;
                    if (pTVar7->type == CloseBracket) {
                      SVar6 = pTVar7->sid;
                      if (SVar6 == CloseBrace) {
                        bVar21 = checkBracketPair((ParserContext *)local_c8,pTVar7,
                                                  (
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)auStack_188,OpenBrace);
                      }
                      else if (SVar6 == CloseBracket) {
                        bVar21 = checkBracketPair((ParserContext *)local_c8,pTVar7,
                                                  (
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)auStack_188,OpenBracket);
                      }
                      else {
                        if (SVar6 != CloseParenthesis) {
                          auStack_68 = (undefined1  [8])
                                       &n.
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi._0_6_ = 0x6e7265746e69;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi._6_2_ = 0x6c61;
                          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               (element_type *)0xe;
                          auStack_88 = (undefined1  [8])0x0;
                          it._M_current = (Token **)0x0;
                          local_78 = (Token *)0x0;
                          ParserContext::errorAtToken
                                    ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_68,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)auStack_88);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)auStack_88);
                          if (auStack_68 !=
                              (undefined1  [8])
                              &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount) {
                            operator_delete((void *)auStack_68);
                          }
                          puVar27 = (undefined8 *)__cxa_allocate_exception(8);
                          *puVar27 = &PTR__exception_002461d8;
                          __cxa_throw(puVar27,&AbortCompilingException::typeinfo,
                                      std::exception::~exception);
                        }
                        bVar21 = checkBracketPair((ParserContext *)local_c8,pTVar7,
                                                  (
                                                  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                                  *)auStack_188,OpenParenthesis);
                      }
                      if (bVar21 == false) goto LAB_00188469;
                    }
                    else if (pTVar7->type == OpenBracket) {
                      std::
                      vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                      ::emplace_back<chatra::StringId_const&,chatra::Token_const*&>
                                ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                                  *)auStack_188,&pTVar7->sid,__args_1);
                    }
                    lVar23 = lVar43 + 8;
                    lVar43 = lVar43 + 8;
                  } while ((Token **)((long)__dest + lVar23) != ppTVar40);
                  if (auStack_188 !=
                      (undefined1  [8])
                      stack.
                      super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    _Var44._M_current = (Token **)((long)__dest + lVar43 + -8);
                    if (lVar43 == 0x10) {
                      _Var44._M_current = _Var4._M_current;
                    }
                    pTVar7 = *_Var44._M_current;
                    local_1a8._16_7_ = 0x686374616d6e75;
                    uStack_191 = 0x27206465;
                    local_1a8._8_8_ = (_Elt_pointer)0xb;
                    uStack_18d = 0;
                    lVar23 = (ulong)stack.
                                    super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].first * 0x20;
                    local_160._0_8_ = local_160 + 0x10;
                    lVar43 = *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar23);
                    local_1a8._0_8_ = (_Elt_pointer)(local_1a8 + 0x10);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_160,lVar43,
                               *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar23 + 8) +
                               lVar43);
                    psVar34 = (pointer)0xf;
                    if ((_Elt_pointer)local_1a8._0_8_ != (_Elt_pointer)(local_1a8 + 0x10)) {
                      psVar34 = (pointer)CONCAT17((undefined1)uStack_191,local_1a8._16_7_);
                    }
                    psVar16 = (pointer)((long)&((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                                 *)local_160._8_8_)->_M_ptr +
                                       (long)&((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                                *)local_1a8._8_8_)->_M_ptr);
                    if (psVar34 < psVar16) {
                      psVar34 = (pointer)0xf;
                      if ((_Elt_pointer)local_160._0_8_ != (_Elt_pointer)(local_160 + 0x10)) {
                        psVar34 = (pointer)local_160._16_8_;
                      }
                      if (psVar34 < psVar16) goto LAB_00188318;
                      plVar24 = (long *)std::__cxx11::string::replace
                                                  ((ulong)local_160,0,(char *)0x0,local_1a8._0_8_);
                    }
                    else {
LAB_00188318:
                      plVar24 = (long *)std::__cxx11::string::_M_append(local_1a8,local_160._0_8_);
                    }
                    auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
                    pbVar1 = (pointer)(plVar24 + 2);
                    if ((pointer)*plVar24 == pbVar1) {
                      local_78 = (Token *)(pbVar1->_M_dataplus)._M_p;
                      ppsStack_70 = (_Map_pointer)plVar24[3];
                    }
                    else {
                      local_78 = (Token *)(pbVar1->_M_dataplus)._M_p;
                      auStack_88 = (undefined1  [8])*plVar24;
                    }
                    it._M_current = (Token **)plVar24[1];
                    *plVar24 = (long)pbVar1;
                    plVar24[1] = 0;
                    *(undefined1 *)&(pbVar1->_M_dataplus)._M_p = 0;
                    puVar27 = (undefined8 *)std::__cxx11::string::append(auStack_88);
                    auStack_68 = (undefined1  [8])
                                 &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount;
                    p_Var28 = (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)(puVar27 + 2);
                    if ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)*puVar27 == p_Var28) {
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._0_6_ = (undefined6)*(undefined8 *)p_Var28;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._6_2_ = (undefined2)((ulong)*(undefined8 *)p_Var28 >> 0x30);
                    }
                    else {
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._0_6_ = (undefined6)*(undefined8 *)p_Var28;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._6_2_ = (undefined2)((ulong)*(undefined8 *)p_Var28 >> 0x30);
                      auStack_68 = (undefined1  [8])*puVar27;
                    }
                    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)puVar27[1];
                    *puVar27 = p_Var28;
                    puVar27[1] = 0;
                    *(undefined1 *)(puVar27 + 2) = 0;
                    local_1f8[0]._M_nxt = (_Hash_node_base *)0x0;
                    aMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
                    pp_Var3 = &aMap._M_h._M_single_bucket;
                    ParserContext::errorAtNextToken
                              ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_68,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)pp_Var3);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)pp_Var3);
                    if (auStack_68 !=
                        (undefined1  [8])
                        &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                    {
                      operator_delete((void *)auStack_68);
                    }
                    if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
                      operator_delete((void *)auStack_88);
                    }
                    if ((_Elt_pointer)local_160._0_8_ != (_Elt_pointer)(local_160 + 0x10)) {
                      operator_delete((void *)local_160._0_8_);
                    }
                    if ((_Elt_pointer)local_1a8._0_8_ != (_Elt_pointer)(local_1a8 + 0x10)) {
                      operator_delete((void *)local_1a8._0_8_);
                    }
LAB_00188469:
                    lVar43 = 0x10;
                  }
                  if (auStack_188 != (undefined1  [8])0x0) {
                    operator_delete((void *)auStack_188);
                  }
                }
                if (((lVar43 != 0x10) &&
                    (_Var44._M_current = lVar43 + __dest,
                    _Var44._M_current !=
                    (Token **)
                    ((((ct.sTable)->
                      super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    strToId)._M_h._M_element_count)) && ((*_Var44._M_current)->sid == CloseBrace)) {
                  parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                            ((chatra *)auStack_1c8,(ParserContext *)local_c8,_Var4,_Var44);
                  wrapByTuple((chatra *)auStack_68,(shared_ptr<chatra::Node> *)auStack_1c8,
                              (Token *)0x0);
                  if (outNodes.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               outNodes.
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                  }
                  std::
                  vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                  ::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                              *)auStack_a8,
                             pending_1.
                             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             *(undefined8 *)((long)auStack_68 + 0x60),
                             *(undefined8 *)((long)auStack_68 + 0x68));
                  ppTVar40 = _Var44._M_current + 1;
                  if (__dest != ppTVar40) {
                    peVar9 = ((ct.sTable)->
                             super___shared_ptr<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    sVar31 = (peVar9->strToId)._M_h._M_element_count - (long)ppTVar40;
                    if (sVar31 != 0) {
                      memmove(__dest,ppTVar40,sVar31);
                    }
                    sVar10 = (peVar9->strToId)._M_h._M_element_count;
                    sVar39 = (long)__dest + (sVar10 - (long)ppTVar40);
                    if (sVar10 != sVar39) {
                      (peVar9->strToId)._M_h._M_element_count = sVar39;
                    }
                  }
                  __position._M_current = (shared_ptr<chatra::Node> *)ct.sTable;
                  if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              );
                    __position._M_current = (shared_ptr<chatra::Node> *)ct.sTable;
                  }
                  goto LAB_00188119;
                }
                pTVar7 = __dest[1];
                auStack_68 = (undefined1  [8])
                             &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                auStack_88 = (undefined1  [8])0x13;
                auStack_68 = (undefined1  [8])
                             std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = auStack_88._0_6_;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = auStack_88._6_2_;
                *(undefined8 *)auStack_68 = 0x6465746365707865;
                *(undefined8 *)((long)auStack_68 + 8) = 0x7461746f6e6e6120;
                *(undefined4 *)((long)auStack_68 + 0xf) = 0x6e6f6974;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auStack_88;
                *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)((long)auStack_68 + (long)auStack_88) =
                     (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      )0x0;
                auStack_88 = (undefined1  [8])0x0;
                it._M_current = (Token **)0x0;
                local_78 = (Token *)0x0;
                ParserContext::errorAtNextToken
                          ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                __position._M_current = (shared_ptr<chatra::Node> *)ct.sTable;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if (auStack_68 ==
                    (undefined1  [8])
                    &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                break;
              }
              else {
                p_Var2 = &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ;
                auStack_88 = (undefined1  [8])0x1f;
                auStack_68 = (undefined1  [8])p_Var2;
                auStack_68 = (undefined1  [8])
                             std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _0_6_ = auStack_88._0_6_;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                _6_2_ = auStack_88._6_2_;
                *(undefined8 *)((long)auStack_68 + 0xf) = 0x6d616e206e6f6974;
                *(undefined8 *)((long)auStack_68 + 0x17) = 0x227b2220726f2065;
                *(undefined8 *)auStack_68 = 0x6465746365707865;
                *(undefined8 *)((long)auStack_68 + 8) = 0x7461746f6e6e6120;
                n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auStack_88;
                *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)((long)auStack_68 + (long)auStack_88) =
                     (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      )0x0;
                auStack_88 = (undefined1  [8])0x0;
                it._M_current = (Token **)0x0;
                local_78 = (Token *)0x0;
                ParserContext::errorAtToken
                          ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_68,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)auStack_88);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)auStack_88);
                if (auStack_68 == (undefined1  [8])p_Var2) break;
              }
              operator_delete((void *)auStack_68);
              break;
            }
            _Var4._M_current = __dest + 2;
            parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                      ((chatra *)auStack_68,(ParserContext *)local_c8,
                       (__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                        )(__dest + 1),_Var4);
            std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
            ::emplace_back<std::shared_ptr<chatra::Node>>
                      ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                        *)auStack_a8,(shared_ptr<chatra::Node> *)auStack_68);
            if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            peVar41 = ((__position._M_current)->
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            sVar31 = (long)(peVar41->tokens).
                           super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)_Var4._M_current;
            if (sVar31 != 0) {
              memmove(__dest,_Var4._M_current,sVar31);
            }
            ppTVar8 = (peVar41->tokens).
                      super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppTVar22 = (pointer)((long)__dest + ((long)ppTVar8 - (long)_Var4._M_current));
            if (ppTVar8 != ppTVar22) {
              (peVar41->tokens).
              super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppTVar22;
            }
          }
LAB_00188119:
          ppTVar40 = ((((__position._M_current)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tokens
                     ).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        } while (__dest != ppTVar40);
      }
      node = local_140;
      if (auStack_a8 !=
          (undefined1  [8])
          pending_1.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
          auStack_68 = (undefined1  [8])0x0;
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<decltype(nullptr),std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)auStack_118,auStack_68,auStack_a8);
        }
        else {
          pTVar7 = *(((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->_M_ptr
                    ->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar11 = ((pending_1.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].
                      super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1];
          auStack_68 = (undefined1  [8])
                       &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          auStack_88 = (undefined1  [8])0x1d;
          auStack_68 = (undefined1  [8])
                       std::__cxx11::string::_M_create((ulong *)auStack_68,(ulong)auStack_88);
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ =
               auStack_88._0_6_;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ =
               auStack_88._6_2_;
          *(undefined8 *)((long)auStack_68 + 0xd) = 0x6e6120666f207465;
          *(undefined8 *)((long)auStack_68 + 0x15) = 0x6e6f697461746f6e;
          *(undefined8 *)auStack_68 = 0x6465746365707865;
          *(undefined8 *)((long)auStack_68 + 8) = 0x2074656772617420;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)auStack_88;
          *(_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            *)((long)auStack_68 + (long)auStack_88) =
               (_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                )0x0;
          auStack_88 = (undefined1  [8])0x0;
          it._M_current = (Token **)0x0;
          local_78 = (Token *)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_c8,Error,pTVar7,pTVar11,(string *)auStack_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_88);
          node = local_140;
          if (auStack_68 !=
              (undefined1  [8])
              &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)auStack_68);
          }
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)auStack_a8);
      if ((a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) ||
         (peVar41 = ((__position._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
         (peVar41->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (peVar41->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_finish)) {
        puVar27 = (undefined8 *)a._M_h._M_bucket_count;
        auVar20 = (undefined1  [8])local_240;
        if (auStack_138 !=
            (undefined1  [8])
            pending.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          auStack_68 = (undefined1  [8])
                       ((__position._M_current)->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<chatra::Node*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_240,auStack_68,auStack_138);
          psVar34 = pending.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          auVar42 = auStack_138;
          puVar27 = (undefined8 *)a._M_h._M_bucket_count;
          auVar45 = auStack_138;
          if ((undefined1  [8])
              pending.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start != auStack_138) {
            do {
              p_Var12 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                        &((pointer)auVar45)->_M_string_length)->_M_pi;
              if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
              }
              auVar45 = (undefined1  [8])&((pointer)auVar45)->field_2;
            } while (auVar45 != (undefined1  [8])psVar34);
            pending.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar42;
            puVar27 = (undefined8 *)a._M_h._M_bucket_count;
            __position._M_current = (shared_ptr<chatra::Node> *)ct.sTable;
          }
        }
        for (; auStack_68 = auVar20, puVar27 != (undefined8 *)0x0; puVar27 = (undefined8 *)*puVar27)
        {
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_insert<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,false>>>>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_240,puVar27 + 1,auStack_68);
          auVar20 = auStack_68;
        }
        __position._M_current = __position._M_current + 1;
        node = local_140;
      }
      else {
        __position = std::
                     vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ::_M_erase(local_1d0,__position);
        auStack_88 = (undefined1  [8])0x0;
        pmVar26 = std::__detail::
                  _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)auStack_118,(key_type *)auStack_88);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  *)auStack_68,pmVar26);
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_138,
                   pending.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,auStack_68,
                   n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_68);
      }
      std::
      _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_118);
    } while (__position._M_current !=
             (node->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_138);
  replaceSyntaxSugar((ParserContext *)local_c8,(AnnotationMap *)local_240,node);
  auStack_1c8 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar34 = (node->blockNodes).
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ct.sTable = (shared_ptr<chatra::StringTable> *)
              (node->blockNodes).
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar34 != (pointer)ct.sTable) {
    do {
      peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar46 = (size_type *)((ulong)((uint)peVar41->type * 0x28) + stAttrs);
      peVar13 = (peVar41->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar13 != (element_type *)0x0) && (peVar13->containsError == true)) {
        auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_118,
                   "interpreter reached at the line which contains error on lexical analysis","");
        auStack_68 = (undefined1  [8])0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0;
        peVar13 = (peVar41->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        (**(code **)(*(long *)ct.ws + 0x10))
                  (ct.ws,2,&peVar13->fileName,peVar13->lineNo,&peVar13->line,0xffffffffffffffff,
                   0xffffffffffffffff,(string *)auStack_118,auStack_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_68);
        if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) {
          operator_delete((void *)auStack_118);
        }
        puVar27 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar27 = &PTR__exception_002461d8;
        __cxa_throw(puVar27,&AbortCompilingException::typeinfo,std::exception::~exception);
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      resize(&peVar41->subNodes,*psVar46);
      auStack_88 = (undefined1  [8])
                   ((((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + psVar46[1]);
      pSVar14 = (StatementPatternElement *)psVar46[3];
      if ((StatementPatternElement *)psVar46[2] == pSVar14) {
LAB_00188aa5:
        peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (auStack_88 ==
            (undefined1  [8])
            (peVar41->tokens).
            super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (peVar41->type == Def) {
            auStack_188 = (undefined1  [8])
                          &stack.
                           super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_188,"expected \".name(parameters)\"","");
            bVar21 = checkCombination((ParserContext *)local_c8,psVar34,4,5,(string *)auStack_188);
            bVar21 = !bVar21;
            if (auStack_188 !=
                (undefined1  [8])
                &stack.
                 super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)auStack_188);
            }
          }
          else {
            bVar21 = false;
          }
          if (!bVar21) {
            if (((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                type == Class) {
              aMap._M_h._M_single_bucket = local_1f8;
              pp_Var3 = &aMap._M_h._M_single_bucket;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)pp_Var3,"expected \"extends base-classes,...\"","");
              bVar21 = checkCombination((ParserContext *)local_c8,psVar34,2,3,(string *)pp_Var3);
              bVar21 = !bVar21;
              if (aMap._M_h._M_single_bucket != local_1f8) {
                operator_delete(aMap._M_h._M_single_bucket);
              }
            }
            else {
              bVar21 = false;
            }
            if (!bVar21) {
              peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr;
              if (peVar41->type == Def) {
                if ((*(long *)&(peVar41->subNodes).
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[6].
                               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> == 0) ||
                   (psVar16 = (peVar41->blockNodes).
                              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                   psVar16 ==
                   (peVar41->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)) {
                  lVar43 = *(long *)&(peVar41->subNodes).
                                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[6].
                                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
                  if ((lVar43 == 0) || (1 < peVar41->sid - Init)) {
                    lVar43 = *(long *)&((peVar41->subNodes).
                                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
                    if (lVar43 != 0) {
                      pTVar7 = (Token *)**(undefined8 **)(lVar43 + 0x18);
                      auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)auStack_118,
                                 "static qualifier is reserved keyword, currently not working","");
                      auStack_68 = (undefined1  [8])0x0;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)0x0;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._0_6_ = 0;
                      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._6_2_ = 0;
                      ParserContext::errorAtToken
                                ((ParserContext *)local_c8,Warning,pTVar7,(string *)auStack_118,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)auStack_68);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)auStack_68);
                      if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) {
                        operator_delete((void *)auStack_118);
                      }
                    }
                    goto LAB_00188e20;
                  }
                  pTVar7 = (Token *)**(undefined8 **)(lVar43 + 0x18);
                  auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)auStack_118,
                             "\"init\" and \"deinit\" cannot be deleted method","");
                  auStack_68 = (undefined1  [8])0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _0_6_ = 0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _6_2_ = 0;
                  ParserContext::errorAtToken
                            ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_118,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_68);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_68);
                  if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) goto LAB_00188b25;
                }
                else {
                  peVar41 = (psVar16->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)auStack_118,"deleted method cannot have nested block","");
                  auStack_68 = (undefined1  [8])0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _0_6_ = 0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _6_2_ = 0;
                  peVar13 = (peVar41->line).
                            super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  (**(code **)(*(long *)ct.ws + 0x10))
                            (ct.ws,2,&peVar13->fileName,peVar13->lineNo,&peVar13->line,
                             0xffffffffffffffff,0xffffffffffffffff,(string *)auStack_118,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_68);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_68);
                  if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) {
LAB_00188b25:
                    operator_delete((void *)auStack_118);
                  }
                }
              }
              else {
LAB_00188e20:
                peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
                if ((peVar41->type == Class) &&
                   (lVar43 = *(long *)&((peVar41->subNodes).
                                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>,
                   lVar43 != 0)) {
                  pTVar7 = (Token *)**(undefined8 **)(lVar43 + 0x18);
                  auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)auStack_118,
                             "static qualifier is reserved keyword, currently not working","");
                  auStack_68 = (undefined1  [8])0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _0_6_ = 0;
                  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                  _6_2_ = 0;
                  ParserContext::errorAtToken
                            ((ParserContext *)local_c8,Warning,pTVar7,(string *)auStack_118,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_68);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)auStack_68);
                  if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) {
                    operator_delete((void *)auStack_118);
                  }
                }
                peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
                if ((peVar41->type == Def) &&
                   (lVar43 = *(long *)&(peVar41->subNodes).
                                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[7].
                                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>,
                   lVar43 != 0)) {
                  puVar27 = *(undefined8 **)(lVar43 + 0x60);
                  bVar21 = puVar27 == *(undefined8 **)(lVar43 + 0x68);
                  if (!bVar21) {
                    pcVar35 = (char *)*puVar27;
                    if ((*pcVar35 == '\x1b') && (*(int *)(pcVar35 + 0x34) == 0x67)) {
                      uVar36 = peVar41->flags;
                      do {
                        puVar27 = puVar27 + 2;
                        uVar36 = uVar36 | 1;
                        bVar21 = puVar27 == *(undefined8 **)(lVar43 + 0x68);
                        if (bVar21) {
                          peVar41->flags = uVar36;
                          goto LAB_00188fd9;
                        }
                        pcVar35 = (char *)*puVar27;
                      } while ((*pcVar35 == '\x1b') && (*(int *)(pcVar35 + 0x34) == 0x67));
                      peVar41->flags = uVar36;
                    }
                    else {
                      bVar21 = false;
                    }
                    pTVar7 = (Token *)**(undefined8 **)(pcVar35 + 0x18);
                    pTVar11 = *(Token **)(*(long *)(pcVar35 + 0x20) + -8);
                    auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
                    auStack_68 = (undefined1  [8])0x13;
                    auStack_118 = (undefined1  [8])
                                  std::__cxx11::string::_M_create
                                            ((ulong *)auStack_118,(ulong)auStack_68);
                    a._M_h._M_bucket_count = (size_type)auStack_68;
                    (((pointer)auStack_118)->_M_dataplus)._M_p = (pointer)0x6465746365707865;
                    ((pointer)auStack_118)->_M_string_length = 0x6966696c61757120;
                    *(undefined4 *)((long)&((pointer)auStack_118)->_M_string_length + 7) =
                         0x73726569;
                    a._M_h._M_buckets = (__buckets_ptr)auStack_68;
                    *(char *)((long)auStack_68 + (long)&((pointer)auStack_118)->_M_dataplus) = '\0';
                    auStack_68 = (undefined1  [8])0x0;
                    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    ._0_6_ = 0;
                    n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    ._6_2_ = 0;
                    ParserContext::errorAtToken
                              ((ParserContext *)local_c8,Error,pTVar7,pTVar11,(string *)auStack_118,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)auStack_68);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)auStack_68);
                    if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) {
                      operator_delete((void *)auStack_118);
                    }
                  }
LAB_00188fd9:
                  if (!bVar21) goto LAB_0018902e;
                }
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)auStack_1c8,psVar34);
                if (!recursive) {
                  node_00 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr;
                  NVar5 = node_00->type;
                  if ((NVar5 == IfGroup) || (NVar5 == Sync)) {
                    parseInnerNode(local_1d8,local_1e0,local_1e8,node_00,false);
                    LOCK();
                    (((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->blockNodesState)._M_i = Parsed;
                    UNLOCK();
                  }
                }
              }
            }
          }
        }
        else {
          pTVar7 = *(Token **)auStack_88;
          auStack_118 = (undefined1  [8])&a._M_h._M_bucket_count;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_118,"extra token","");
          auStack_68 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0
          ;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0
          ;
          ParserContext::errorAtToken
                    ((ParserContext *)local_c8,Error,pTVar7,(string *)auStack_118,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_68);
          if (auStack_118 != (undefined1  [8])&a._M_h._M_bucket_count) goto LAB_00188b25;
        }
      }
      else {
        bVar21 = false;
        e = (StatementPatternElement *)psVar46[2];
        do {
          last._M_current =
               (((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (auStack_88 == (undefined1  [8])last._M_current) {
            iVar38 = 5;
            if (e->required == true) {
              auStack_118 = (undefined1  [8])0x0;
              a._M_h._M_buckets = (__buckets_ptr)0x0;
              a._M_h._M_bucket_count = 0;
              ParserContext::errorAtNextToken
                        ((ParserContext *)local_c8,Error,last._M_current[-1],&e->errorMessage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_118);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_118);
              iVar38 = 4;
              bVar21 = true;
            }
          }
          else {
            extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                      ((chatra *)auStack_118,(ParserContext *)local_c8,
                       (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                        *)auStack_88,last,e);
            pp_Var19 = a._M_h._M_buckets;
            auVar20 = auStack_118;
            if (auStack_118 == (undefined1  [8])0x0) {
              if (e->required == false) goto LAB_00188a61;
              iVar38 = 4;
              bVar21 = true;
            }
            else {
              sVar15 = e->subNodeIndex;
              if (sVar15 != 0xffffffffffffffff) {
                psVar16 = (((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->subNodes).
                          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                auStack_118 = (undefined1  [8])0x0;
                a._M_h._M_buckets = (__buckets_ptr)0x0;
                *(undefined1 (*) [8])
                 &psVar16[sVar15].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> =
                     auVar20;
                this._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                              ((long)(psVar16 + sVar15) + 8);
                *(__buckets_ptr *)((long)(psVar16 + sVar15) + 8) = pp_Var19;
                if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
                }
              }
LAB_00188a61:
              iVar38 = 0;
            }
            if (a._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a._M_h._M_buckets);
            }
          }
        } while (((iVar38 == 5) || (iVar38 == 0)) &&
                (pSVar33 = e + 1, e = e + 1, pSVar33 != pSVar14));
        if (!bVar21) goto LAB_00188aa5;
      }
LAB_0018902e:
      psVar34 = psVar34 + 1;
    } while (psVar34 != (pointer)ct.sTable);
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  operator=(local_1d0,
            (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             *)auStack_1c8);
  auStack_68 = (undefined1  [8])&p_Stack_38;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x1;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_6_ = 0;
  n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  if (aMap._M_h._M_bucket_count != 0) {
    plVar24 = (long *)aMap._M_h._M_bucket_count;
    do {
      auStack_118 = (undefined1  [8])0xffffffffffffffff;
      a._M_h._M_buckets = (__buckets_ptr)0x0;
      std::
      _Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<void_const*const&,std::pair<unsigned_long,decltype(nullptr)>>
                ((_Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)auStack_68,plVar24 + 1,auStack_118);
      plVar24 = (long *)*plVar24;
    } while (plVar24 != (long *)0x0);
  }
  a._M_h._M_rehash_policy._M_next_resize = 0;
  a._M_h._M_single_bucket = (__node_base_ptr)0x0;
  a._M_h._M_element_count = 0;
  a._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  a._M_h._M_rehash_policy._4_4_ = 0;
  a._M_h._M_bucket_count = 0;
  a._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  auStack_118 = (undefined1  [8])0x0;
  a._M_h._M_buckets = (__buckets_ptr)0x0;
  std::_Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_118,0);
  psVar34 = (local_140->blockNodes).
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar16 = (local_140->blockNodes).
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar34 != psVar16) {
    do {
      std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      push_back((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_118,psVar34);
      peVar41 = (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar41 != (element_type *)0x0) && (peVar41->type == IfGroup)) {
        auStack_88 = (undefined1  [8])a._M_h._M_rehash_policy._M_next_resize;
        it._M_current = (Token **)a._M_h._M_single_bucket;
        local_78 = (Token *)0x0;
        ppsStack_70 = (_Map_pointer)0x0;
        std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                  ((iterator *)local_1a8,
                   (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_118,(const_iterator *)auStack_88,
                   (peVar41->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (peVar41->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar34 = psVar34 + 1;
    } while (psVar34 != psVar16);
  }
  if (a._M_h._M_rehash_policy._M_next_resize != a._M_h._M_bucket_count) {
    do {
      uVar29 = (long)(a._M_h._M_bucket_count - (long)a._M_h._M_before_begin._M_nxt) >> 4;
      puVar30 = (ulong *)a._M_h._M_bucket_count;
      if (0x1f < uVar29) {
        uVar32 = (uVar29 >> 5) + 0xf800000000000000;
        if (0 < (long)uVar29) {
          uVar32 = uVar29 >> 5;
        }
        puVar30 = (ulong *)((uVar29 + uVar32 * -0x20) * 0x10 +
                           *(long *)(a._M_h._M_rehash_policy._0_8_ + uVar32 * 8));
      }
      auStack_a8 = (undefined1  [8])*puVar30;
      pending_1.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar30[1];
      if (pending_1.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = &((pending_1.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
          *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var2 = &((pending_1.
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
          *(int *)&p_Var2->_M_pi = *(int *)&p_Var2->_M_pi + 1;
        }
      }
      std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      pop_front((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_118);
      if (auStack_a8 != (undefined1  [8])0x0) {
        plVar24 = *(long **)((long)auStack_68 +
                            ((ulong)auStack_a8 %
                            (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr) * 8);
        plVar25 = (long *)0x0;
        if ((plVar24 != (long *)0x0) &&
           (plVar25 = plVar24, plVar37 = (long *)*plVar24,
           auStack_a8 != (undefined1  [8])((long *)*plVar24)[1])) {
          while (plVar24 = (long *)*plVar37, plVar24 != (long *)0x0) {
            plVar25 = (long *)0x0;
            if (((ulong)plVar24[1] %
                 (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (ulong)auStack_a8 %
                 (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
               (plVar25 = plVar37, plVar37 = plVar24, auStack_a8 == (undefined1  [8])plVar24[1]))
            goto LAB_0018926b;
          }
          plVar25 = (long *)0x0;
        }
LAB_0018926b:
        if (plVar25 == (long *)0x0) {
          lVar43 = 0;
        }
        else {
          lVar43 = *plVar25;
        }
        if (lVar43 != 0) {
          *(undefined8 *)(lVar43 + 0x10) = 0;
          *(undefined1 (*) [8])(lVar43 + 0x18) = auStack_a8;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar43 + 0x20),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pending_1);
        }
        peVar17 = (((pointer)((long)auStack_a8 + 0x20))->
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        for (peVar41 = (element_type *)
                       (((pointer)((long)auStack_a8 + 0x10))->
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                       _M_pi; peVar41 != peVar17; peVar41 = (element_type *)&peVar41->line) {
          pp_Var18 = *(_func_int ***)&peVar41->type;
          plVar24 = *(long **)((long)auStack_68 +
                              ((ulong)pp_Var18 %
                              (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr) * 8);
          plVar25 = (long *)0x0;
          if ((plVar24 != (long *)0x0) &&
             (plVar25 = plVar24, plVar37 = (long *)*plVar24,
             pp_Var18 != (_func_int **)((long *)*plVar24)[1])) {
            while (plVar24 = (long *)*plVar37, plVar24 != (long *)0x0) {
              plVar25 = (long *)0x0;
              if (((ulong)plVar24[1] %
                   (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                   (ulong)pp_Var18 %
                   (ulong)n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr) ||
                 (plVar25 = plVar37, plVar37 = plVar24, pp_Var18 == (_func_int **)plVar24[1]))
              goto LAB_0018930a;
            }
            plVar25 = (long *)0x0;
          }
LAB_0018930a:
          if (plVar25 == (long *)0x0) {
            lVar43 = 0;
          }
          else {
            lVar43 = *plVar25;
          }
          if ((lVar43 != 0) &&
             (uVar29 = (long)(((pointer)((long)auStack_a8 + 0x20))->
                             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr -
                       (long)(((pointer)((long)auStack_a8 + 0x10))->
                             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi >> 3, uVar29 <= *(ulong *)(lVar43 + 0x10))) {
            *(ulong *)(lVar43 + 0x10) = uVar29;
            *(undefined1 (*) [8])(lVar43 + 0x18) = auStack_a8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar43 + 0x20),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pending_1);
          }
        }
        local_1a8._0_8_ = a._M_h._M_rehash_policy._M_next_resize;
        local_1a8._8_8_ = a._M_h._M_single_bucket;
        local_1a8._16_7_ = 0;
        uStack_191 = 0;
        uStack_18d = 0;
        uStack_18c = 0;
        std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                  ((iterator *)local_160,
                   (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_118,(const_iterator *)local_1a8,
                   (shared_ptr<chatra::Node> *)
                   (((pointer)((long)auStack_a8 + 0x60))->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   (shared_ptr<chatra::Node> *)
                   (((pointer)((long)auStack_a8 + 0x60))->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi);
      }
      if (pending_1.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   pending_1.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (a._M_h._M_rehash_policy._M_next_resize != a._M_h._M_bucket_count);
  }
  plVar24 = (long *)CONCAT26(n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._6_2_,
                             n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._0_6_);
  if (plVar24 != (long *)0x0) {
    do {
      pmVar26 = std::__detail::
                _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_240,(key_type *)(plVar24 + 1));
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)auStack_a8,pmVar26);
      if (plVar24[2] == -1) {
        pTVar7 = *(((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8)->_M_ptr->
                  tokens).
                  super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_160._0_8_ = local_160 + 0x10;
        auStack_138 = (undefined1  [8])0x3f;
        local_160._0_8_ = std::__cxx11::string::_M_create((ulong *)local_160,(ulong)auStack_138);
        local_160._16_8_ = auStack_138;
        builtin_strncpy((char *)((long)&(((_Elt_pointer)(local_160._0_8_ + 0x20))->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_refcount._M_pi + 7)," start f",8);
        builtin_strncpy((char *)((long)&(((_Elt_pointer)(local_160._0_8_ + 0x30))->
                                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + 7),"rom here",8);
        (((_Elt_pointer)(local_160._0_8_ + 0x20))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x6f6e6e6120656874;
        (((_Elt_pointer)(local_160._0_8_ + 0x20))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20736e6f69746174;
        (((_Elt_pointer)(local_160._0_8_ + 0x10))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x746169636f737361;
        (((_Elt_pointer)(local_160._0_8_ + 0x10))->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2068746977206465;
        (((_Elt_pointer)local_160._0_8_)->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x7469746e65206f6e;
        (((_Elt_pointer)local_160._0_8_)->
        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x20646e756f662079;
        local_160._8_8_ = auStack_138;
        *(undefined1 *)
         ((long)&(((_Elt_pointer)local_160._0_8_)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
         (long)&((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_138)->_M_ptr) = 0
        ;
        auStack_138 = (undefined1  [8])0x0;
        pending.
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        pending.
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)local_c8,Error,pTVar7,(string *)local_160,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_138);
        if ((_Elt_pointer)local_160._0_8_ != (_Elt_pointer)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_);
        }
      }
      else {
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)(plVar24[3] + 0x78),*(undefined8 *)(plVar24[3] + 0x80),auStack_a8,
                   pending_1.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)auStack_a8);
      plVar24 = (long *)*plVar24;
    } while (plVar24 != (long *)0x0);
  }
  std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::~deque
            ((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)auStack_118);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_68);
  if (recursive) {
    psVar16 = (local_140->blockNodes).
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar34 = (local_140->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar34 != psVar16;
        psVar34 = psVar34 + 1) {
      parseInnerNode(local_1d8,local_1e0,local_1e8,
                     (psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     true);
      LOCK();
      (((psVar34->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      blockNodesState)._M_i = Parsed;
      UNLOCK();
    }
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_1c8);
  std::
  _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_240);
  return;
}

Assistant:

void parseInnerNode(ParserWorkingSet& ws, IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Structured);

	ParserContext ct(&ws, errorReceiver, sTable);

	auto aMap = parseInnerAnnotations(ct, node);
	replaceSyntaxSugar(ct, aMap, node);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto& n : node->blockNodes) {
		auto& attr = getStAttr(n->type);

		if (n->line && n->line->containsError) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "interpreter reached at the line which contains error on lexical analysis", {});
			throw AbortCompilingException();
		}

		// Parse subNodes
		n->subNodes.resize(attr.subNodes);

		auto it = n->tokens.cbegin() + attr.skipTokens;
		bool hasError = false;
		for (auto& e : attr.pattern) {
			if (it == n->tokens.cend()) {
				if (!e.required)
					continue;
				chatra_assert(!e.errorMessage.empty());
				ct.errorAtNextToken(ErrorLevel::Error, *n->tokens.back(), e.errorMessage, {});
				hasError = true;
				break;
			}

			auto subNode = extractStatementPiece(ct, it, n->tokens.cend(), e);
			if (subNode) {
				if (e.subNodeIndex != SIZE_MAX) {
					chatra_assert(e.subNodeIndex < n->subNodes.size() && !n->subNodes[e.subNodeIndex]);
					n->subNodes[e.subNodeIndex] = std::move(subNode);
				}
			}
			else if (e.required) {
				hasError = true;
				break;
			}
		}
		if (hasError)
			continue;

		if (it != n->tokens.cend()) {
			ct.errorAtToken(ErrorLevel::Error, **it, "extra token", {});
			continue;
		}

		// Combination check
		if (n->type == NodeType::Def && !checkCombination(ct, n,
				SubNode::Def_Operator, SubNode::Def_OperatorParameter, "expected \".name(parameters)\""))
			continue;
		if (n->type == NodeType::Class && !checkCombination(ct, n,
				SubNode::Class_Extends, SubNode::Class_BaseClassList, "expected \"extends base-classes,...\""))
			continue;
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] && !n->blockNodes.empty()) {
			ct.errorAtLine(ErrorLevel::Error, n->blockNodes[0]->line, "deleted method cannot have nested block", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] &&
				(n->sid == StringId::Init || n->sid == StringId::Deinit)) {
			ct.errorAtToken(ErrorLevel::Error, *n->subNodes[SubNode::Def_Delete]->tokens[0],
					R"("init" and "deinit" cannot be deleted method)", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Def_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}
		if (n->type == NodeType::Class && n->subNodes[SubNode::Class_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Class_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}

		// Additional process (set flags, etc)
		if (n->type == NodeType::Def && !qualifyDef(ct, n))
			continue;

		outNodes.push_back(n);

		if (!recursive) {
			if (n->type == NodeType::Sync || n->type == NodeType::IfGroup) {
				parseInnerNode(ws, errorReceiver, sTable, n.get(), false);
				n->blockNodesState = NodeState::Parsed;
			}
		}
	}

	node->blockNodes = outNodes;
	mapAnnotations(ct, aMap, node);

	if (recursive) {
		for (auto& n : node->blockNodes) {
			parseInnerNode(ws, errorReceiver, sTable, n.get(), true);
			n->blockNodesState = NodeState::Parsed;
		}
	}

	// node->blockNodesState = NodeState::Parsed;
}